

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcColumnType::~IfcColumnType(IfcColumnType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)this = 0x8c10c8;
  *(undefined8 *)&this->field_0x1c0 = 0x8c11e0;
  *(undefined8 *)&this->field_0x88 = 0x8c10f0;
  *(undefined8 *)&this->field_0x98 = 0x8c1118;
  *(undefined8 *)&this->field_0xf0 = 0x8c1140;
  *(undefined8 *)&this->field_0x148 = 0x8c1168;
  *(undefined8 *)&this->field_0x180 = 0x8c1190;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x8c11b8;
  puVar1 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>).field_0x10;
  if (puVar1 != &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>).field_0x20)
  {
    operator_delete(puVar1);
  }
  *(undefined8 *)this = 0x8c14a8;
  *(undefined8 *)&this->field_0x1c0 = 0x8c1570;
  *(undefined8 *)&this->field_0x88 = 0x8c14d0;
  *(undefined8 *)&this->field_0x98 = 0x8c14f8;
  *(undefined8 *)&this->field_0xf0 = 0x8c1520;
  *(undefined8 *)&this->field_0x148 = 0x8c1548;
  if (*(undefined1 **)&this->field_0x158 != &this->field_0x168) {
    operator_delete(*(undefined1 **)&this->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this,&PTR_construction_vtable_24__008c1208);
  operator_delete(this);
  return;
}

Assistant:

IfcColumnType() : Object("IfcColumnType") {}